

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_headers_filter_module.c
# Opt level: O2

void * ngx_http_headers_create_conf(ngx_conf_t *cf)

{
  undefined4 *puVar1;
  
  puVar1 = (undefined4 *)ngx_pcalloc(cf->pool,0x20);
  if (puVar1 != (undefined4 *)0x0) {
    *puVar1 = 6;
  }
  return puVar1;
}

Assistant:

static void *
ngx_http_headers_create_conf(ngx_conf_t *cf)
{
    ngx_http_headers_conf_t  *conf;

    conf = ngx_pcalloc(cf->pool, sizeof(ngx_http_headers_conf_t));
    if (conf == NULL) {
        return NULL;
    }

    /*
     * set by ngx_pcalloc():
     *
     *     conf->headers = NULL;
     *     conf->expires_time = 0;
     *     conf->expires_value = NULL;
     */

    conf->expires = NGX_HTTP_EXPIRES_UNSET;

    return conf;
}